

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_blitter_p.h
# Opt level: O0

void __thiscall
QBlittablePlatformPixmap::markRasterOverlay
          (QBlittablePlatformPixmap *this,QPointF *pos,QTextItem *ti)

{
  QTextItem *ti_local;
  QPointF *pos_local;
  QBlittablePlatformPixmap *this_local;
  
  return;
}

Assistant:

inline void QBlittablePlatformPixmap::markRasterOverlay(const QPointF &pos, const QTextItem &ti)
{
#ifdef QT_BLITTER_RASTEROVERLAY
    QFontMetricsF fm(ti.font());
    QRectF rect = fm.tightBoundingRect(ti.text());
    rect.moveBottomLeft(pos);
    markRasterOverlay(rect);
#else
    Q_UNUSED(pos);
    Q_UNUSED(ti);
#endif
}